

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::
join<char_const(&)[25],char_const*&,char_const(&)[2],char_const*&,char_const(&)[10],char_const*&,char_const(&)[3],char_const*&,char_const(&)[10],char_const*&,char_const(&)[2]>
          (spirv_cross *this,char (*ts) [25],char **ts_1,char (*ts_2) [2],char **ts_3,
          char (*ts_4) [10],char **ts_5,char (*ts_6) [3],char **ts_7,char (*ts_8) [10],char **ts_9,
          char (*ts_10) [2])

{
  undefined1 local_1148 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_4) [10];
  char **ts_local_3;
  char (*ts_local_2) [2];
  char **ts_local_1;
  char (*ts_local) [25];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_4;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1148);
  inner::
  join_helper<char_const(&)[25],char_const*&,char_const(&)[2],char_const*&,char_const(&)[10],char_const*&,char_const(&)[3],char_const*&,char_const(&)[10],char_const*&,char_const(&)[2]>
            ((StringStream<4096UL,_4096UL> *)local_1148,ts,ts_1,ts_2,ts_3,
             (char (*) [10])stream.saved_buffers.stack_storage.aligned_char._184_8_,ts_5,ts_6,ts_7,
             ts_8,ts_9,ts_10);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1148);
  return this;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}